

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<float>::writeWithoutExponentGreaterThan1
                 (char *dest,uint32_t totalLength,uint32_t mantissaLength,int maxDecimalPlaces,int K
                 )

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  uint32_t i;
  uint uVar5;
  
  if (K < 0) {
    memmove(dest + mantissaLength + 1,dest + mantissaLength,(ulong)(totalLength - mantissaLength));
    dest[mantissaLength] = '.';
    if (K + maxDecimalPlaces < 0) {
      lVar3 = (long)(int)(maxDecimalPlaces + mantissaLength);
      pcVar4 = dest + lVar3 + 2;
      do {
        if (lVar3 <= (int)(mantissaLength + 1)) {
          uVar5 = mantissaLength + 2;
          goto LAB_00224acc;
        }
        lVar3 = lVar3 + -1;
        pcVar2 = pcVar4 + -1;
        pcVar1 = pcVar4 + -2;
        pcVar4 = pcVar2;
      } while (*pcVar1 == '0');
    }
    else {
      uVar5 = totalLength + 1;
LAB_00224acc:
      pcVar2 = dest + uVar5;
    }
  }
  else {
    pcVar2 = dest + (ulong)totalLength + 2;
    for (; totalLength < mantissaLength; totalLength = totalLength + 1) {
      pcVar2[-2] = '0';
      pcVar2 = pcVar2 + 1;
    }
    pcVar2[-2] = '.';
    pcVar2[-1] = '0';
  }
  return pcVar2;
}

Assistant:

static char* writeWithoutExponentGreaterThan1 (char* dest, uint32_t totalLength, uint32_t mantissaLength, int maxDecimalPlaces, int K)
    {
        if (K >= 0)
        {
            dest += totalLength;

            for (auto i = totalLength; i < mantissaLength; ++i)
                dest = write (dest, '0');

            return write (dest, '.', '0');
        }

        insertChar (dest + mantissaLength, totalLength - mantissaLength, '.', 1);

        if (K + maxDecimalPlaces >= 0)
            return dest + (totalLength + 1);

        for (auto i = static_cast<int> (mantissaLength) + maxDecimalPlaces; i > static_cast<int> (mantissaLength + 1); --i)
            if (dest[i] != '0')
                return dest + (i + 1);

        return dest + (mantissaLength + 2);
    }